

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageSorters.cpp
# Opt level: O0

void __thiscall FIX::message_order::setOrder(message_order *this,int *order,int size)

{
  int iVar1;
  int *piVar2;
  int local_4c;
  int local_3c;
  undefined1 local_38 [4];
  int i_1;
  int local_24;
  int local_20;
  int field;
  int i;
  int size_local;
  int *order_local;
  message_order *this_local;
  
  if (0 < size) {
    iVar1 = *order;
    this->m_delim = iVar1;
    this->m_largest = iVar1;
    for (local_20 = 1; local_20 < size; local_20 = local_20 + 1) {
      local_24 = order[local_20];
      local_4c = local_24;
      if (local_24 < this->m_largest) {
        local_4c = this->m_largest;
      }
      this->m_largest = local_4c;
    }
    field = size;
    _i = order;
    order_local = (int *)this;
    shared_array<int>::create((shared_array<int> *)local_38,(long)(this->m_largest + 1));
    shared_array<int>::operator=(&this->m_groupOrder,(shared_array<int> *)local_38);
    shared_array<int>::~shared_array((shared_array<int> *)local_38);
    for (local_3c = 0; local_3c < field; local_3c = local_3c + 1) {
      piVar2 = shared_array::operator_cast_to_int_((shared_array *)&this->m_groupOrder);
      piVar2[_i[local_3c]] = local_3c + 1;
    }
  }
  return;
}

Assistant:

void message_order::setOrder(const int order[], int size) {
  if (size < 1) {
    return;
  }
  m_largest = m_delim = order[0];

  // collect all fields and find the largest field number
  for (int i = 1; i < size; ++i) {
    int field = order[i];
    m_largest = m_largest > field ? m_largest : field;
  }

  m_groupOrder = shared_array<int>::create(m_largest + 1);
  for (int i = 0; i < size; ++i) {
    m_groupOrder[order[i]] = i + 1;
  }
}